

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_util.c
# Opt level: O0

char * nbt_error_to_string(nbt_status s)

{
  char *pcStack_10;
  nbt_status s_local;
  
  switch(s) {
  case NBT_OK:
    pcStack_10 = "No error.";
    break;
  case NBT_EZ:
    pcStack_10 = "Fatal zlib error. Corrupt file?";
    break;
  case NBT_EIO:
    pcStack_10 = "IO Error. Nonexistant/corrupt file?";
    break;
  case NBT_EMEM:
    pcStack_10 = "Out of memory. You should buy some RAM.";
    break;
  case NBT_ERR:
    pcStack_10 = "NBT tree is corrupt.";
    break;
  default:
    pcStack_10 = "Unknown error.";
  }
  return pcStack_10;
}

Assistant:

const char* nbt_error_to_string(nbt_status s)
{
    switch(s)
    {
    case NBT_OK:
        return "No error.";
    case NBT_ERR:
        return "NBT tree is corrupt.";
    case NBT_EMEM:
        return "Out of memory. You should buy some RAM.";
    case NBT_EIO:
        return "IO Error. Nonexistant/corrupt file?";
    case NBT_EZ:
        return "Fatal zlib error. Corrupt file?";
    default:
        return "Unknown error.";
    }
}